

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resDivs.c
# Opt level: O1

int Res_NodeRef_rec(Abc_Obj_t *pNode)

{
  Abc_Obj_t *pNode_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  uVar1 = *(uint *)&pNode->field_0x14 & 0xf;
  iVar3 = 0;
  if ((uVar1 != 2) && (iVar3 = 0, uVar1 != 5)) {
    if ((pNode->vFanins).nSize < 1) {
      iVar3 = 1;
    }
    else {
      iVar3 = 1;
      lVar4 = 0;
      do {
        pNode_00 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar4]];
        iVar2 = (pNode_00->vFanouts).nSize;
        (pNode_00->vFanouts).nSize = iVar2 + 1;
        if (iVar2 == 0) {
          iVar2 = Res_NodeRef_rec(pNode_00);
          iVar3 = iVar3 + iVar2;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (pNode->vFanins).nSize);
    }
  }
  return iVar3;
}

Assistant:

int Res_NodeRef_rec( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    int i, Counter = 1;
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( pFanin->vFanouts.nSize++ == 0 )
            Counter += Res_NodeRef_rec( pFanin );
    }
    return Counter;
}